

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_model_component.cpp
# Opt level: O0

bool __thiscall
ON_ModelComponent::Internal_SetAsSystemComponent(ON_ModelComponent *this,bool bUnsetSystemComponent)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ON_NameHash *pOVar6;
  bool bUniqueNameIncludesParent;
  bool bUniqueNameRequired;
  bool bIndexRequired;
  bool bUnsetSystemComponent_local;
  ON_ModelComponent *this_local;
  
  if (this->m_locked_status == 0xffff) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
               ,0x30f,"","component is already a system component.");
    return true;
  }
  bVar1 = IndexRequired(this->m_component_type);
  bVar2 = UniqueNameRequired(this->m_component_type);
  bVar3 = UniqueNameIncludesParent(this->m_component_type);
  bVar4 = ParentIdIsNotNil(this);
  if ((!bVar4) && (bVar4 = ParentIdIsSet(this), bVar3 == bVar4)) {
    bVar3 = IdIsNil(this);
    if (bVar3) {
      if (!bUnsetSystemComponent) goto LAB_0076738d;
    }
    else if (bUnsetSystemComponent) goto LAB_0076738d;
    if ((!bVar1) || (bUnsetSystemComponent)) {
      bVar1 = IndexIsSet(this);
      if (bVar1) goto LAB_0076738d;
    }
    else {
      bVar1 = IndexIsSet(this);
      if (((!bVar1) || (iVar5 = Index(this), -1 < iVar5)) ||
         (iVar5 = Index(this), iVar5 < -0x7ffffffe)) goto LAB_0076738d;
    }
    bVar1 = ON_ComponentStatus::operator!=(&this->m_component_status,this->m_component_status);
    if (!bVar1) {
      if ((!bVar2) || (bUnsetSystemComponent)) {
        bVar1 = NameIsSet(this);
        if (bVar1) {
          return false;
        }
        pOVar6 = NameHash(this);
        bVar1 = ON_NameHash::IsEmptyNameHash(pOVar6);
        if (bVar1) {
LAB_00767375:
          this->m_locked_status = 0xffff;
          this->m_content_version_number = 0;
          return true;
        }
      }
      else {
        bVar1 = NameIsNotEmpty(this);
        if (bVar1) {
          pOVar6 = NameHash(this);
          bVar1 = ON_NameHash::IsValidAndNotEmpty(pOVar6);
          if (bVar1) goto LAB_00767375;
        }
      }
    }
  }
LAB_0076738d:
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_model_component.cpp"
             ,0x350,"","Invalid settings for a system component.");
  return false;
}

Assistant:

bool ON_ModelComponent::Internal_SetAsSystemComponent(
  bool bUnsetSystemComponent
  )
{
  if (m_locked_status == 0xFFFFU)
  {
    ON_ERROR("component is already a system component.");
    return true;
  }

  const bool bIndexRequired = ON_ModelComponent::IndexRequired(m_component_type);
  const bool bUniqueNameRequired = ON_ModelComponent::UniqueNameRequired(m_component_type);
  const bool bUniqueNameIncludesParent = ON_ModelComponent::UniqueNameIncludesParent(m_component_type);

  for (;;)
  {
    if (ParentIdIsNotNil())
      break;

    if (bUniqueNameIncludesParent != ParentIdIsSet())
      break;
    
    if (IdIsNil())
    {
      if (!bUnsetSystemComponent)
        break;
    }
    else
    {
      if (bUnsetSystemComponent)
        break;
    }
    
    if ( bIndexRequired && false == bUnsetSystemComponent )
    {
      if (false == IndexIsSet())
        break;
      if (Index() >= 0)
        break;
      if (Index() <= ON_UNSET_INT_INDEX)
        break;
    }
    else
    {
      if (IndexIsSet())
        break;
    }
    
    if ( ON_ModelComponent::m_component_status != m_component_status ) 
      break;

    if (bUniqueNameRequired && false == bUnsetSystemComponent)
    {
      if (false == NameIsNotEmpty())
        break;
      if (false == NameHash().IsValidAndNotEmpty())
        break;
    }
    else
    {
      if (NameIsSet())
        return false;
      if (false == NameHash().IsEmptyNameHash())
        break;
    }

    m_locked_status = 0xFFFFU;
    m_content_version_number = 0;
    return true;
  }

  ON_ERROR("Invalid settings for a system component.");
  return false;
}